

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

uchar * format_from_rgba(uint32_t *data,uint pixels,format_t format)

{
  size_t __size;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  png_uint_32 pVar6;
  png_uint_32 pVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  png_controlp ppVar9;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  png_controlp *pppVar15;
  int iVar16;
  uchar *puVar17;
  void *pvVar18;
  undefined4 extraout_var;
  png_imagep image;
  FILE *pFVar19;
  png_structp png_ptr;
  png_infop info_ptr;
  png_bytepp image_00;
  undefined4 extraout_var_00;
  uchar *extraout_RAX;
  undefined1 *puVar20;
  uint extraout_EDX;
  size_t size;
  int iVar21;
  ulong uVar22;
  undefined4 in_register_00000034;
  png_alloc_size_t *memory_bytes;
  png_image *ppVar23;
  ulong uVar24;
  undefined8 *puVar25;
  png_imagep image_01;
  png_image *__filename;
  png_image *__filename_00;
  uint uVar26;
  png_image *ppVar27;
  uchar *data8;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  png_infop ppStack_228;
  png_structp ppStack_220;
  png_image *ppStack_218;
  undefined1 *puStack_210;
  png_image pStack_1e8;
  png_alloc_size_t *ppStack_180;
  undefined1 *puStack_178;
  png_imagep ppStack_170;
  png_imagep ppStack_168;
  png_image pStack_150;
  undefined8 *puStack_e0;
  undefined1 *puStack_d8;
  code *pcStack_d0;
  png_image pStack_c8;
  void *pvStack_60;
  code *pcStack_58;
  
  memory_bytes = (png_alloc_size_t *)CONCAT44(in_register_00000034,pixels);
  if (format + FORMAT_BGRA8888 < 9) {
    uVar22 = (ulong)pixels;
    switch(format) {
    default:
      goto switchD_001100f9_caseD_0;
    case FORMAT_BGRA8888:
      puVar17 = (uchar *)malloc(uVar22 * 4);
      if (pixels != 0) {
        uVar24 = 0;
        do {
          uVar4 = data[uVar24];
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)
                                                  (uVar4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar4 >> 0x10),uVar4)) >> 0x20),
                                                  uVar4) >> 0x18),
                                               CONCAT12((char)(uVar4 >> 8),(short)uVar4)) >> 0x10),
                               (short)uVar4) & 0xffff00ff00ff00ff;
          auVar28 = pshuflw(auVar28,auVar28,0xc6);
          sVar11 = auVar28._0_2_;
          sVar12 = auVar28._2_2_;
          sVar13 = auVar28._4_2_;
          sVar14 = auVar28._6_2_;
          *(uint *)(puVar17 + uVar24 * 4) =
               CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar28[6] - (0xff < sVar14),
                        CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar28[4] - (0xff < sVar13),
                                 CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar28[2] -
                                          (0xff < sVar12),
                                          (0 < sVar11) * (sVar11 < 0x100) * auVar28[0] -
                                          (0xff < sVar11))));
          uVar24 = uVar24 + 1;
        } while (uVar22 != uVar24);
      }
      break;
    case FORMAT_RGB565:
      puVar17 = (uchar *)malloc(uVar22 * 2);
      if (pixels != 0) {
        uVar24 = 0;
        do {
          uVar26 = data[uVar24];
          *(ushort *)(puVar17 + uVar24 * 2) =
               (ushort)(uVar26 >> 0x13) & 0x1f |
               (ushort)(uVar26 >> 5) & 0x7e0 | (ushort)((uVar26 & 0xf8) << 8);
          uVar24 = uVar24 + 1;
        } while (uVar22 != uVar24);
      }
      break;
    case FORMAT_ARGB4444:
      puVar17 = (uchar *)malloc(uVar22 * 2);
      if (pixels != 0) {
        uVar24 = 0;
        do {
          uVar26 = data[uVar24];
          puVar17[uVar24 * 2] =
               (byte)(((uVar26 >> 8 & 0xff) + 8) * 0xf10 >> 0xc) & 0xf0 |
               (byte)(((uVar26 >> 0x10 & 0xff) + 8) / 0x11);
          puVar17[uVar24 * 2 + 1] =
               (byte)((uVar26 >> 0x18) * 0xf10 + 0x7880 >> 0xc) & 0xf0 |
               (byte)(((uVar26 & 0xff) + 8) / 0x11);
          uVar24 = uVar24 + 1;
        } while (uVar22 != uVar24);
      }
      break;
    case FORMAT_GRAY8:
      puVar17 = (uchar *)malloc(uVar22);
      if (pixels != 0) {
        uVar24 = 0;
        do {
          puVar17[uVar24] = (uchar)data[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar22 != uVar24);
      }
      break;
    case 0xffffffff:
      pvVar18 = malloc(uVar22 << 2);
      puVar17 = (uchar *)memcpy(pvVar18,data,uVar22 << 2);
      return puVar17;
    }
    return puVar17;
  }
switchD_001100f9_caseD_0:
  pvVar18 = (void *)(ulong)format;
  format_from_rgba_cold_1();
  iVar16 = (int)memory_bytes;
  ppVar27 = (png_image *)((ulong)memory_bytes & 0xffffffff);
  __size = (long)ppVar27 * 4;
  pcStack_58 = (code *)0x11028c;
  puVar17 = (uchar *)malloc(__size);
  switch(extraout_EDX) {
  default:
    pcStack_58 = png_read_mem;
    puVar25 = (undefined8 *)(ulong)extraout_EDX;
    format_to_rgba_cold_1();
    image_01 = &pStack_c8;
    pStack_c8.opaque = (png_controlp)0x0;
    pStack_c8.message[0x2c] = '\0';
    pStack_c8.message[0x2d] = '\0';
    pStack_c8.message[0x2e] = '\0';
    pStack_c8.message[0x2f] = '\0';
    pStack_c8.message[0x30] = '\0';
    pStack_c8.message[0x31] = '\0';
    pStack_c8.message[0x32] = '\0';
    pStack_c8.message[0x33] = '\0';
    pStack_c8.message[0x34] = '\0';
    pStack_c8.message[0x35] = '\0';
    pStack_c8.message[0x36] = '\0';
    pStack_c8.message[0x37] = '\0';
    pStack_c8.message[0x38] = '\0';
    pStack_c8.message[0x39] = '\0';
    pStack_c8.message[0x3a] = '\0';
    pStack_c8.message[0x3b] = '\0';
    pStack_c8.message[0x1c] = '\0';
    pStack_c8.message[0x1d] = '\0';
    pStack_c8.message[0x1e] = '\0';
    pStack_c8.message[0x1f] = '\0';
    pStack_c8.message[0x20] = '\0';
    pStack_c8.message[0x21] = '\0';
    pStack_c8.message[0x22] = '\0';
    pStack_c8.message[0x23] = '\0';
    pStack_c8.message[0x24] = '\0';
    pStack_c8.message[0x25] = '\0';
    pStack_c8.message[0x26] = '\0';
    pStack_c8.message[0x27] = '\0';
    pStack_c8.message[0x28] = '\0';
    pStack_c8.message[0x29] = '\0';
    pStack_c8.message[0x2a] = '\0';
    pStack_c8.message[0x2b] = '\0';
    pStack_c8.message[0xc] = '\0';
    pStack_c8.message[0xd] = '\0';
    pStack_c8.message[0xe] = '\0';
    pStack_c8.message[0xf] = '\0';
    pStack_c8.message[0x10] = '\0';
    pStack_c8.message[0x11] = '\0';
    pStack_c8.message[0x12] = '\0';
    pStack_c8.message[0x13] = '\0';
    pStack_c8.message[0x14] = '\0';
    pStack_c8.message[0x15] = '\0';
    pStack_c8.message[0x16] = '\0';
    pStack_c8.message[0x17] = '\0';
    pStack_c8.message[0x18] = '\0';
    pStack_c8.message[0x19] = '\0';
    pStack_c8.message[0x1a] = '\0';
    pStack_c8.message[0x1b] = '\0';
    pStack_c8.warning_or_error = 0;
    pStack_c8.message[0] = '\0';
    pStack_c8.message[1] = '\0';
    pStack_c8.message[2] = '\0';
    pStack_c8.message[3] = '\0';
    pStack_c8.message[4] = '\0';
    pStack_c8.message[5] = '\0';
    pStack_c8.message[6] = '\0';
    pStack_c8.message[7] = '\0';
    pStack_c8.message[8] = '\0';
    pStack_c8.message[9] = '\0';
    pStack_c8.message[10] = '\0';
    pStack_c8.message[0xb] = '\0';
    pStack_c8.height = 0;
    pStack_c8.format = 0;
    pStack_c8.flags = 0;
    pStack_c8.colormap_entries = 0;
    pStack_c8.message[0x3c] = '\0';
    pStack_c8.message[0x3d] = '\0';
    pStack_c8.message[0x3e] = '\0';
    pStack_c8.message[0x3f] = '\0';
    pStack_c8._100_4_ = 0;
    pStack_c8.version = 1;
    pStack_c8.width = 0;
    pcStack_d0 = (code *)0x110457;
    pvStack_60 = pvVar18;
    pcStack_58 = (code *)(ulong)extraout_EDX;
    png_image_begin_read_from_memory(&pStack_c8,memory_bytes,size);
    if ((pStack_c8._32_8_ & 2) == 0) {
      pStack_c8.format = 3;
      *(png_uint_32 *)(puVar25 + 1) = pStack_c8.width;
      *(png_uint_32 *)((long)puVar25 + 0xc) = pStack_c8.height;
      *(undefined4 *)(puVar25 + 2) = 0xffffffff;
      pcStack_d0 = (code *)0x110489;
      pvVar18 = malloc((ulong)(pStack_c8.width * pStack_c8.height * 4));
      *puVar25 = pvVar18;
      memory_bytes = (png_alloc_size_t *)0x0;
      pcStack_d0 = (code *)0x11049e;
      iVar16 = png_image_finish_read(&pStack_c8,(png_const_colorp)0x0,pvVar18,0,(void *)0x0);
      if ((pStack_c8._32_8_ & 2) == 0) {
        return (uchar *)CONCAT44(extraout_var,iVar16);
      }
    }
    else {
      pcStack_d0 = (code *)0x1104b5;
      png_read_mem_cold_1();
    }
    pcStack_d0 = png_write_mem;
    png_read_mem_cold_2();
    image = &pStack_150;
    pStack_150.opaque = (png_controlp)0x0;
    pStack_150.message[0x2c] = '\0';
    pStack_150.message[0x2d] = '\0';
    pStack_150.message[0x2e] = '\0';
    pStack_150.message[0x2f] = '\0';
    pStack_150.message[0x30] = '\0';
    pStack_150.message[0x31] = '\0';
    pStack_150.message[0x32] = '\0';
    pStack_150.message[0x33] = '\0';
    pStack_150.message[0x34] = '\0';
    pStack_150.message[0x35] = '\0';
    pStack_150.message[0x36] = '\0';
    pStack_150.message[0x37] = '\0';
    pStack_150.message[0x38] = '\0';
    pStack_150.message[0x39] = '\0';
    pStack_150.message[0x3a] = '\0';
    pStack_150.message[0x3b] = '\0';
    pStack_150.message[0x1c] = '\0';
    pStack_150.message[0x1d] = '\0';
    pStack_150.message[0x1e] = '\0';
    pStack_150.message[0x1f] = '\0';
    pStack_150.message[0x20] = '\0';
    pStack_150.message[0x21] = '\0';
    pStack_150.message[0x22] = '\0';
    pStack_150.message[0x23] = '\0';
    pStack_150.message[0x24] = '\0';
    pStack_150.message[0x25] = '\0';
    pStack_150.message[0x26] = '\0';
    pStack_150.message[0x27] = '\0';
    pStack_150.message[0x28] = '\0';
    pStack_150.message[0x29] = '\0';
    pStack_150.message[0x2a] = '\0';
    pStack_150.message[0x2b] = '\0';
    pStack_150.message[0xc] = '\0';
    pStack_150.message[0xd] = '\0';
    pStack_150.message[0xe] = '\0';
    pStack_150.message[0xf] = '\0';
    pStack_150.message[0x10] = '\0';
    pStack_150.message[0x11] = '\0';
    pStack_150.message[0x12] = '\0';
    pStack_150.message[0x13] = '\0';
    pStack_150.message[0x14] = '\0';
    pStack_150.message[0x15] = '\0';
    pStack_150.message[0x16] = '\0';
    pStack_150.message[0x17] = '\0';
    pStack_150.message[0x18] = '\0';
    pStack_150.message[0x19] = '\0';
    pStack_150.message[0x1a] = '\0';
    pStack_150.message[0x1b] = '\0';
    pStack_150.warning_or_error = 0;
    pStack_150.message[0] = '\0';
    pStack_150.message[1] = '\0';
    pStack_150.message[2] = '\0';
    pStack_150.message[3] = '\0';
    pStack_150.message[4] = '\0';
    pStack_150.message[5] = '\0';
    pStack_150.message[6] = '\0';
    pStack_150.message[7] = '\0';
    pStack_150.message[8] = '\0';
    pStack_150.message[9] = '\0';
    pStack_150.message[10] = '\0';
    pStack_150.message[0xb] = '\0';
    pStack_150.colormap_entries = 0;
    pStack_150.message[0x3c] = '\0';
    pStack_150.message[0x3d] = '\0';
    pStack_150.message[0x3e] = '\0';
    pStack_150.message[0x3f] = '\0';
    pStack_150._100_4_ = 0;
    pStack_150.version = 1;
    uVar8 = image_01->version;
    uVar10 = image_01->width;
    pStack_150.format = 3;
    pStack_150.flags = 2;
    ppStack_168 = (png_imagep)0x110531;
    pStack_150.width = uVar8;
    pStack_150.height = uVar10;
    puStack_e0 = puVar25;
    puStack_d8 = (undefined1 *)&pStack_c8;
    pcStack_d0 = (code *)__size;
    png_image_write_to_memory(image,(void *)0x0,memory_bytes,0,image_01->opaque,0,(void *)0x0);
    if ((pStack_150._32_8_ & 2) == 0) {
      ppStack_168 = (png_imagep)0x110540;
      image = (png_imagep)malloc(*memory_bytes);
      pppVar15 = &image_01->opaque;
      image_01 = &pStack_150;
      ppStack_168 = (png_imagep)0x110566;
      png_image_write_to_memory(image_01,image,memory_bytes,0,*pppVar15,0,(void *)0x0);
      if ((pStack_150._32_8_ & 2) == 0) {
        return (uchar *)image;
      }
    }
    else {
      ppStack_168 = (png_imagep)0x110587;
      png_write_mem_cold_1();
    }
    __filename = &pStack_150;
    ppStack_168 = (png_imagep)png_read;
    png_write_mem_cold_2();
    __filename_00 = &pStack_1e8;
    pStack_1e8.opaque = (png_controlp)0x0;
    pStack_1e8.message[0x2c] = '\0';
    pStack_1e8.message[0x2d] = '\0';
    pStack_1e8.message[0x2e] = '\0';
    pStack_1e8.message[0x2f] = '\0';
    pStack_1e8.message[0x30] = '\0';
    pStack_1e8.message[0x31] = '\0';
    pStack_1e8.message[0x32] = '\0';
    pStack_1e8.message[0x33] = '\0';
    pStack_1e8.message[0x34] = '\0';
    pStack_1e8.message[0x35] = '\0';
    pStack_1e8.message[0x36] = '\0';
    pStack_1e8.message[0x37] = '\0';
    pStack_1e8.message[0x38] = '\0';
    pStack_1e8.message[0x39] = '\0';
    pStack_1e8.message[0x3a] = '\0';
    pStack_1e8.message[0x3b] = '\0';
    pStack_1e8.message[0x1c] = '\0';
    pStack_1e8.message[0x1d] = '\0';
    pStack_1e8.message[0x1e] = '\0';
    pStack_1e8.message[0x1f] = '\0';
    pStack_1e8.message[0x20] = '\0';
    pStack_1e8.message[0x21] = '\0';
    pStack_1e8.message[0x22] = '\0';
    pStack_1e8.message[0x23] = '\0';
    pStack_1e8.message[0x24] = '\0';
    pStack_1e8.message[0x25] = '\0';
    pStack_1e8.message[0x26] = '\0';
    pStack_1e8.message[0x27] = '\0';
    pStack_1e8.message[0x28] = '\0';
    pStack_1e8.message[0x29] = '\0';
    pStack_1e8.message[0x2a] = '\0';
    pStack_1e8.message[0x2b] = '\0';
    pStack_1e8.message[0xc] = '\0';
    pStack_1e8.message[0xd] = '\0';
    pStack_1e8.message[0xe] = '\0';
    pStack_1e8.message[0xf] = '\0';
    pStack_1e8.message[0x10] = '\0';
    pStack_1e8.message[0x11] = '\0';
    pStack_1e8.message[0x12] = '\0';
    pStack_1e8.message[0x13] = '\0';
    pStack_1e8.message[0x14] = '\0';
    pStack_1e8.message[0x15] = '\0';
    pStack_1e8.message[0x16] = '\0';
    pStack_1e8.message[0x17] = '\0';
    pStack_1e8.message[0x18] = '\0';
    pStack_1e8.message[0x19] = '\0';
    pStack_1e8.message[0x1a] = '\0';
    pStack_1e8.message[0x1b] = '\0';
    pStack_1e8.warning_or_error = 0;
    pStack_1e8.message[0] = '\0';
    pStack_1e8.message[1] = '\0';
    pStack_1e8.message[2] = '\0';
    pStack_1e8.message[3] = '\0';
    pStack_1e8.message[4] = '\0';
    pStack_1e8.message[5] = '\0';
    pStack_1e8.message[6] = '\0';
    pStack_1e8.message[7] = '\0';
    pStack_1e8.message[8] = '\0';
    pStack_1e8.message[9] = '\0';
    pStack_1e8.message[10] = '\0';
    pStack_1e8.message[0xb] = '\0';
    pStack_1e8.height = 0;
    pStack_1e8.format = 0;
    pStack_1e8.flags = 0;
    pStack_1e8.colormap_entries = 0;
    pStack_1e8.message[0x3c] = '\0';
    pStack_1e8.message[0x3d] = '\0';
    pStack_1e8.message[0x3e] = '\0';
    pStack_1e8.message[0x3f] = '\0';
    pStack_1e8._100_4_ = 0;
    pStack_1e8.version = 1;
    pStack_1e8.width = 0;
    ppStack_180 = memory_bytes;
    puStack_178 = (undefined1 *)ppVar27;
    ppStack_170 = image_01;
    ppStack_168 = image;
    pFVar19 = fopen((char *)__filename,"rb");
    if (pFVar19 == (FILE *)0x0) {
      png_read_cold_3();
    }
    else {
      png_image_begin_read_from_stdio(&pStack_1e8,(FILE *)pFVar19);
      if ((pStack_1e8._32_8_ & 2) == 0) {
        pStack_1e8.format = 3;
        puVar17 = (uchar *)malloc(0x18);
        *(png_uint_32 *)(puVar17 + 8) = pStack_1e8.width;
        *(png_uint_32 *)(puVar17 + 0xc) = pStack_1e8.height;
        puVar17[0x10] = 0xff;
        puVar17[0x11] = 0xff;
        puVar17[0x12] = 0xff;
        puVar17[0x13] = 0xff;
        pvVar18 = malloc((ulong)(pStack_1e8.width * pStack_1e8.height * 4));
        *(void **)puVar17 = pvVar18;
        png_image_finish_read(&pStack_1e8,(png_const_colorp)0x0,pvVar18,0,(void *)0x0);
        ppVar27 = &pStack_1e8;
        if ((pStack_1e8._32_8_ & 2) == 0) {
          fclose(pFVar19);
          return puVar17;
        }
        goto LAB_00110681;
      }
    }
    png_read_cold_1();
LAB_00110681:
    ppVar23 = __filename;
    png_read_cold_2();
    ppStack_218 = __filename;
    puStack_210 = (undefined1 *)ppVar27;
    pFVar19 = fopen((char *)__filename_00,"wb");
    if (pFVar19 == (FILE *)0x0) {
      png_write_cold_1();
      puVar17 = extraout_RAX;
    }
    else {
      pVar6 = ppVar23->height;
      iVar21 = 0;
      iVar16 = 6;
      if (pVar6 == 7) {
        iVar16 = 0;
      }
      png_ptr = png_create_write_struct
                          ("1.6.44",(png_voidp)0x0,(png_error_ptr)0x0,(png_error_ptr)0x0);
      ppStack_220 = png_ptr;
      png_set_compression_level(png_ptr,1);
      info_ptr = png_create_info_struct(png_ptr);
      ppStack_228 = info_ptr;
      png_init_io(png_ptr,(png_FILE_p)pFVar19);
      png_set_IHDR(png_ptr,info_ptr,ppVar23->version,ppVar23->width,8,iVar16,0,0,0);
      png_write_info(png_ptr,info_ptr);
      uVar22 = (ulong)ppVar23->width;
      image_00 = (png_bytepp)malloc(uVar22 * 8);
      if (uVar22 != 0) {
        ppVar9 = ppVar23->opaque;
        pVar7 = ppVar23->version;
        uVar24 = 0;
        do {
          image_00[uVar24] =
               (png_byte *)((long)&ppVar9->png_ptr + (ulong)(uint)(iVar21 << (pVar6 != 7) * '\x02'))
          ;
          uVar24 = uVar24 + 1;
          iVar21 = iVar21 + pVar7;
        } while (uVar22 != uVar24);
      }
      png_write_image(png_ptr,image_00);
      free(image_00);
      png_write_end(png_ptr,info_ptr);
      png_destroy_write_struct(&ppStack_220,&ppStack_228);
      iVar16 = fclose(pFVar19);
      puVar17 = (uchar *)CONCAT44(extraout_var_00,iVar16);
    }
    return puVar17;
  case 1:
    if (iVar16 != 0) {
      puVar20 = (undefined1 *)0x0;
      do {
        uVar5 = *(undefined4 *)((long)pvVar18 + (long)puVar20 * 4);
        auVar29._8_8_ = 0;
        auVar29._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar5 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar5 >> 0x10),uVar5)) >>
                                                  0x20),uVar5) >> 0x18),
                                             CONCAT12((char)((uint)uVar5 >> 8),(short)uVar5)) >>
                                   0x10),(short)uVar5) & 0xffff00ff00ff00ff;
        auVar28 = pshuflw(auVar29,auVar29,0xc6);
        sVar11 = auVar28._0_2_;
        sVar12 = auVar28._2_2_;
        sVar13 = auVar28._4_2_;
        sVar14 = auVar28._6_2_;
        *(uint *)(puVar17 + (long)puVar20 * 4) =
             CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar28[6] - (0xff < sVar14),
                      CONCAT12((0 < sVar13) * (sVar13 < 0x100) * auVar28[4] - (0xff < sVar13),
                               CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar28[2] -
                                        (0xff < sVar12),
                                        (0 < sVar11) * (sVar11 < 0x100) * auVar28[0] -
                                        (0xff < sVar11))));
        puVar20 = puVar20 + 1;
      } while (ppVar27 != (png_image *)puVar20);
    }
    break;
  case 3:
    if (iVar16 != 0) {
      puVar20 = (undefined1 *)0x0;
      do {
        uVar3 = *(ushort *)((long)pvVar18 + (long)puVar20 * 2);
        uVar26 = uVar3 & 0x20;
        *(uint *)(puVar17 + (long)puVar20 * 4) =
             uVar3 >> 0xb & 1 | uVar3 >> 10 & 2 |
             uVar3 >> 9 & 4 |
             (uVar26 << 4 | (uVar3 & 0x7e0) << 5 | (uVar3 & 1) << 0x10 | (uint)uVar3 << 0x13) +
             uVar26 * 8 + (uint)(uVar3 >> 0xb) * 8 | 0xff000000;
        puVar20 = puVar20 + 1;
      } while (ppVar27 != (png_image *)puVar20);
    }
    break;
  case 5:
    if (iVar16 != 0) {
      puVar20 = (undefined1 *)0x0;
      do {
        bVar1 = *(byte *)((long)pvVar18 + (long)puVar20 * 2 + 1);
        bVar2 = *(byte *)((long)pvVar18 + (long)puVar20 * 2);
        uVar26 = bVar2 & 0xf;
        *(uint *)(puVar17 + (long)puVar20 * 4) =
             ((uint)bVar1 << 0x14 | (uint)bVar1) & 0xf00000f | (bVar1 & 0xfffffff0) << 0x18 |
             (bVar1 & 0xf) << 4 | uVar26 << 0x14 | uVar26 << 0x10 | (bVar2 & 0xf0) << 8 |
             (bVar2 & 0xf0) << 4;
        puVar20 = puVar20 + 1;
      } while (ppVar27 != (png_image *)puVar20);
    }
    break;
  case 7:
    if (iVar16 != 0) {
      puVar20 = (undefined1 *)0x0;
      do {
        *(uint *)(puVar17 + (long)puVar20 * 4) =
             (uint)*(byte *)((long)pvVar18 + (long)puVar20) * 0x10101 | 0xff000000;
        puVar20 = puVar20 + 1;
      } while (ppVar27 != (png_image *)puVar20);
    }
    break;
  case 0xffffffff:
    puVar17 = (uchar *)memcpy(puVar17,pvVar18,__size);
    return puVar17;
  }
  return puVar17;
}

Assistant:

unsigned char*
format_from_rgba(
    const uint32_t* data,
    unsigned int pixels,
    format_t format)
{
    unsigned int i;
    unsigned char* out = NULL;

    if (format == FORMAT_GRAY8) {
        out = malloc(pixels);
        for (i = 0; i < pixels; ++i) {
            out[i] = data[i] & 0xff;
        }
    } else if (format == FORMAT_BGRA8888) {
        const unsigned char* data8 = (const unsigned char*)data;
        out = malloc(sizeof(uint32_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            out[i * sizeof(uint32_t) + 0] = data8[i * sizeof(uint32_t) + 2];
            out[i * sizeof(uint32_t) + 1] = data8[i * sizeof(uint32_t) + 1];
            out[i * sizeof(uint32_t) + 2] = data8[i * sizeof(uint32_t) + 0];
            out[i * sizeof(uint32_t) + 3] = data8[i * sizeof(uint32_t) + 3];
        }
    } else if (format == FORMAT_ARGB4444) {
        out = malloc(sizeof(uint16_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            /* Use the extra precision for rounding. */
            const unsigned char r = (((data[i] & 0xff000000) >> 24) + 8) / 17;
            const unsigned char g = (((data[i] &   0xff0000) >> 16) + 8) / 17;
            const unsigned char b = (((data[i] &     0xff00) >>  8) + 8) / 17;
            const unsigned char a = (((data[i] &       0xff)      ) + 8) / 17;

            out[i * sizeof(uint16_t) + 0] = (b << 4) | g;
            out[i * sizeof(uint16_t) + 1] = (r << 4) | a;
        }
    } else if (format == FORMAT_RGB565) {
        uint16_t* out16;
        out = malloc(sizeof(uint16_t) * pixels);
        out16 = (uint16_t*)out;
        for (i = 0; i < pixels; ++i) {
                     /* 00000000 00000000 11111000 -> 00000000 00011111 */
            out16[i] = ((data[i] &     0xf8) << 8)
                     /* 00000000 11111100 00000000 -> 00000111 11100000 */
                     | ((data[i] &   0xfc00) >> 5)
                     /* 11111000 00000000 00000000 -> 11111000 00000000 */
                     | ((data[i] & 0xf80000) >>19);
        }
    } else if (format == FORMAT_RGBA8888) {
        out = malloc(sizeof(uint32_t) * pixels);
        memcpy(out, data, sizeof(uint32_t) * pixels);
    } else {
        fprintf(stderr, "%s: unknown format: %u\n", argv0, format);
        abort();
    }

    return out;
}